

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.hpp
# Opt level: O2

void burst::detail::
     radix_sort_impl_bi_iteration<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>,burst::low_byte_fn,long(*)[256],long*>
               (move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                first,move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                      last,
               move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
               buffer_begin,long param_4,long param_5,size_t param_6)

{
  long lVar1;
  long lVar2;
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  map;
  compose_fn<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_izvolov[P]burst_include_burst_algorithm_detail_nth_radix_hpp:19:17),_burst::compose_fn<burst::shift_to_unsigned_fn,_burst::to_ordered_integral_fn>_>
  map_00;
  size_t __n;
  long lVar3;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_40;
  undefined8 local_38;
  
  __n = (long)last._M_current._M_current - (long)first._M_current._M_current;
  lVar3 = (long)__n >> 3;
  lVar1 = *(long *)(param_5 + param_6 * 8);
  lVar2 = *(long *)(param_5 + 8 + param_6 * 8);
  if (lVar2 != lVar3 || lVar1 != lVar3) {
    if (lVar1 == lVar3) {
      if (last._M_current._M_current != first._M_current._M_current) {
        memmove((void *)buffer_begin._M_current._M_current,(void *)first._M_current._M_current,__n);
      }
    }
    else {
      map.l._8_8_ = uStack_40;
      map.l.radix_number = param_6;
      map._16_8_ = local_38;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (first,last,buffer_begin._M_current._M_current,map,
                 (long *)(param_6 * 0x800 + param_4));
    }
    if (lVar2 == lVar3) {
      if (last._M_current._M_current != first._M_current._M_current) {
        memmove((void *)first._M_current._M_current,(void *)buffer_begin._M_current._M_current,__n);
        return;
      }
    }
    else {
      map_00.l._8_8_ = uStack_58;
      map_00.l.radix_number = param_6 + 1;
      map_00._16_8_ = local_50;
      dispose_backward<std::move_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,burst::compose_fn<burst::detail::nth_radix<burst::low_byte_fn>(unsigned_long,burst::low_byte_fn)::_lambda(auto:1)_1_,burst::compose_fn<burst::shift_to_unsigned_fn,burst::to_ordered_integral_fn>>,long*>
                (buffer_begin,
                 (move_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
                  )(__n + (long)buffer_begin._M_current._M_current),first._M_current._M_current,
                 map_00,(long *)(param_4 + (param_6 + 1) * 0x800));
    }
  }
  return;
}

Assistant:

void
            radix_sort_impl_bi_iteration
            (
                RandomAccessIterator1 first,
                RandomAccessIterator1 last,
                RandomAccessIterator2 buffer_begin,
                Map map,
                Radix radix,
                RandomAccessIterator3 counters,
                RandomAccessIterator4 maximums,
                std::size_t radix_number
            )
        {
            using std::distance;
            const auto range_size = distance(first, last);
            const auto buffer_end = std::next(buffer_begin, range_size);

            const auto nth_is_single = maximums[radix_number] == range_size;
            const auto n1th_is_single = maximums[radix_number + 1] == range_size;

            if (nth_is_single && n1th_is_single)
            {
                return;
            }

            if (nth_is_single)
            {
                std::move(first, last, buffer_begin);
            }
            else
            {
                dispose_backward(std::make_move_iterator(first), std::make_move_iterator(last), buffer_begin, compose(nth_radix(radix_number, radix), map), std::begin(counters[radix_number]));
            }

            if (n1th_is_single)
            {
                std::move(buffer_begin, buffer_end, first);
            }
            else
            {
                dispose_backward(std::make_move_iterator(buffer_begin), std::make_move_iterator(buffer_end), first, compose(nth_radix(radix_number + 1, radix), map), std::begin(counters[radix_number + 1]));
            }
        }